

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O1

void __thiscall OpenMD::ForceManager::~ForceManager(ForceManager *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppFVar2;
  SwitchingFunction *pSVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar4;
  pointer pdVar5;
  pointer pVVar6;
  pointer piVar7;
  pointer ppVar8;
  ForceModifier **elem;
  pointer ppFVar9;
  
  this->_vptr_ForceManager = (_func_int **)&PTR__ForceManager_00307d30;
  ppFVar2 = (this->forceModifiers_).
            super__Vector_base<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar9 = (this->forceModifiers_).
                 super__Vector_base<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppFVar9 != ppFVar2;
      ppFVar9 = ppFVar9 + 1) {
    if (*ppFVar9 != (ForceModifier *)0x0) {
      (*(*ppFVar9)->_vptr_ForceModifier[1])();
    }
  }
  pSVar3 = this->switcher_;
  if (pSVar3 != (SwitchingFunction *)0x0) {
    this_00 = (pSVar3->switchSpline_).
              super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    operator_delete(pSVar3,0x40);
  }
  if (this->interactionMan_ != (InteractionManager *)0x0) {
    (*this->interactionMan_->_vptr_InteractionManager[1])();
  }
  if (this->fDecomp_ != (ForceDecomposition *)0x0) {
    (*this->fDecomp_->_vptr_ForceDecomposition[1])();
  }
  if (this->thermo != (Thermo *)0x0) {
    operator_delete(this->thermo,8);
  }
  SelectionEvaluator::~SelectionEvaluator(&this->evaluator_);
  SelectionManager::~SelectionManager(&this->seleMan_);
  pcVar4 = (this->selectionScript_)._M_dataplus._M_p;
  paVar1 = &(this->selectionScript_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  ppFVar9 = (this->forceModifiers_).
            super__Vector_base<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar9 != (pointer)0x0) {
    operator_delete(ppFVar9,(long)(this->forceModifiers_).
                                  super__Vector_base<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppFVar9
                   );
  }
  pdVar5 = (this->electrostaticScale_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar5 != (pointer)0x0) {
    operator_delete(pdVar5,(long)(this->electrostaticScale_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar5);
  }
  pdVar5 = (this->vdwScale_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar5 != (pointer)0x0) {
    operator_delete(pdVar5,(long)(this->vdwScale_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar5);
  }
  pVVar6 = (this->savedPositions_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pVVar6 != (pointer)0x0) {
    operator_delete(pVVar6,(long)(this->savedPositions_).
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar6);
  }
  piVar7 = (this->point_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar7 != (pointer)0x0) {
    operator_delete(piVar7,(long)(this->point_).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar7);
  }
  piVar7 = (this->neighborList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar7 != (pointer)0x0) {
    operator_delete(piVar7,(long)(this->neighborList_).super__Vector_base<int,_std::allocator<int>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar7);
  }
  std::
  _Rb_tree<OpenMD::Inversion_*,_std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>,_std::_Select1st<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>,_std::less<OpenMD::Inversion_*>,_std::allocator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>_>
  ::~_Rb_tree(&(this->inversionDataSets)._M_t);
  std::
  _Rb_tree<OpenMD::Torsion_*,_std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>,_std::_Select1st<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
  ::~_Rb_tree(&(this->torsionDataSets)._M_t);
  std::
  _Rb_tree<OpenMD::Bend_*,_std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>,_std::_Select1st<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
  ::~_Rb_tree(&(this->bendDataSets)._M_t);
  ppVar8 = (this->interactions_).
           super__Vector_base<std::pair<OpenMD::AtomType_*,_OpenMD::AtomType_*>,_std::allocator<std::pair<OpenMD::AtomType_*,_OpenMD::AtomType_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar8 != (pointer)0x0) {
    operator_delete(ppVar8,(long)(this->interactions_).
                                 super__Vector_base<std::pair<OpenMD::AtomType_*,_OpenMD::AtomType_*>,_std::allocator<std::pair<OpenMD::AtomType_*,_OpenMD::AtomType_*>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar8);
  }
  std::
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  ::~_Rb_tree(&(this->atomTypes_)._M_t);
  return;
}

Assistant:

ForceManager::~ForceManager() {
    Utils::deletePointers(forceModifiers_);

    delete switcher_;
    delete interactionMan_;
    delete fDecomp_;
    delete thermo;
  }